

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intcall.c
# Opt level: O2

void cause_interruptcall(uint atom_index)

{
  DLword *pDVar1;
  DLword DVar2;
  short sVar3;
  int iVar4;
  LispPTR *pLVar5;
  fnhead *pfVar6;
  uint uVar7;
  ulong uVar8;
  bool bVar9;
  
  MachineState.pvar[-9] = MachineState.pvar[-9] | 0x100;
  DVar2 = StackOffsetFromNative(MachineState.csp);
  MachineState.pvar[-5] = DVar2 + 4;
  pLVar5 = (LispPTR *)(MachineState.csp + 2);
  MachineState.csp = MachineState.csp + 2;
  *pLVar5 = MachineState.tosvalue;
  MachineState.ivar = (DLword *)((ulong)((uint)MachineState.pvar[-5] * 2) + (long)Stackspace);
  MachineState.pvar[-6] = (short)MachineState.currentpc - (short)MachineState.currentfunc;
  if ((atom_index & 0xfff0000) == 0) {
    pLVar5 = (LispPTR *)(AtomSpace + (ulong)(atom_index * 5) * 2);
  }
  else {
    pLVar5 = NativeAligned4FromLAddr(atom_index);
  }
  pfVar6 = (fnhead *)NativeAligned4FromLAddr(pLVar5[2] & 0xfffffff);
  if (MachineState.endofstack < MachineState.csp + (ulong)pfVar6->stkmin + 0x20) {
    iVar4 = do_stackoverflow(1);
    if (iVar4 != 0) {
      pDVar1 = MachineState.csp;
      MachineState.csp = MachineState.csp + 2;
      pDVar1[2] = 0;
      pDVar1[3] = 0xe;
      contextsw(2,0xffff,1);
      return;
    }
  }
  iVar4 = (int)pfVar6->na;
  MachineState.currentfunc = pfVar6;
  if (-1 < pfVar6->na) {
    while (bVar9 = iVar4 != 0, iVar4 = iVar4 + -1, bVar9) {
      pDVar1 = MachineState.csp;
      MachineState.csp = MachineState.csp + 2;
      pDVar1[2] = 0;
      pDVar1[3] = 0;
    }
  }
  MachineState.csp = MachineState.csp + 2;
  *(undefined2 *)((ulong)MachineState.csp ^ 2) = 0x8000;
  *(DLword *)((ulong)(MachineState.csp + 1) ^ 2) = MachineState.pvar[-5];
  MachineState.csp = MachineState.csp + 2;
  *(undefined2 *)((ulong)MachineState.csp ^ 2) = 0xc000;
  DVar2 = StackOffsetFromNative(MachineState.pvar);
  *MachineState.csp = DVar2 + 1;
  DVar2 = StackOffsetFromNative(MachineState.csp + -2);
  MachineState.csp[9] = DVar2;
  DVar2 = StackOffsetFromNative(MachineState.pvar);
  MachineState.csp[8] = DVar2;
  MachineState.pvar = MachineState.csp + 10;
  *(LispPTR *)(MachineState.csp + 2) = pLVar5[2] & 0xfffffff;
  MachineState.csp = MachineState.pvar;
  for (sVar3 = (MachineState.currentfunc)->pv + 1; 0 < sVar3; sVar3 = sVar3 + -1) {
    pDVar1 = MachineState.csp + 1;
    MachineState.csp[0] = 0xffff;
    *pDVar1 = 0xffff;
    pDVar1 = MachineState.csp;
    MachineState.csp = MachineState.csp + 2;
    pDVar1[2] = 0xffff;
    pDVar1[3] = 0xffff;
    MachineState.csp = MachineState.csp + 2;
  }
  MachineState.currentpc =
       (ByteCode *)
       ((long)&(MachineState.currentfunc)->na + (ulong)(MachineState.currentfunc)->startpc);
  DVar2 = StackOffsetFromNative(MachineState.csp);
  MachineState.pvar[-5] = DVar2;
  uVar8 = (long)MachineState.endofstack - (long)MachineState.csp;
  if (uVar8 < 2) {
    error("creating 0 length free stack block");
    uVar8 = (long)MachineState.endofstack - (long)MachineState.csp;
  }
  uVar7 = (uint)uVar8;
  if ((uVar8 & 2) != 0) {
    error("creating odd length free stack block");
    uVar7 = (int)MachineState.endofstack - (int)MachineState.csp;
  }
  *(uint *)MachineState.csp = uVar7 >> 1 & 0xffff | 0xa0000000;
  return;
}

Assistant:

void cause_interruptcall(unsigned int atom_index)
/* Atomindex for Function you want to invoke */
{
  struct definition_cell *defcell68k; /* Definition Cell PTR */
  short pv_num;                       /* scratch for pv */
  struct fnhead *tmp_fn;
  int rest; /* use for alignments */

  CURRENTFX->nopush = T;
  CURRENTFX->nextblock = StackOffsetFromNative(CurrentStackPTR) + 4;
  PushCStack; /* save TOS */

  /* Setup IVar */
  IVar = NativeAligned2FromStackOffset(CURRENTFX->nextblock);

  /* Set PC to the Next Instruction and save into pre-FX */
  CURRENTFX->pc = ((UNSIGNED)PC - (UNSIGNED)FuncObj);

  /* Get DEFCELL 68k address */
  defcell68k = (struct definition_cell *)GetDEFCELL68k(atom_index);

  /* Interrupt FN should be compiled code */
  tmp_fn = (struct fnhead *)NativeAligned4FromLAddr(defcell68k->defpointer);

  /* This used to be >=, but I think that was a change from earlier,
     when it was originally >.  I changed it back on 2/2/98 to see
     if that fixes stack overflow trouble.  --JDS */
  if ((UNSIGNED)(CurrentStackPTR + tmp_fn->stkmin + STK_SAFE) > (UNSIGNED)EndSTKP) {
    /*printf("Interrupt:$$ STKOVER when ");
    print(atom_index);
    printf(" was called  *****\n");*/
    DOSTACKOVERFLOW(0, -1);
  }
  FuncObj = tmp_fn;
  SWAPPED_FN_CHECK; /* Check for need to re-swap code stream */
  if (FuncObj->na >= 0) {
    /* This Function is Spread Type */
    /* Arguments on Stack Adjustment  */
    rest = 0 - (FuncObj->na);

    while (rest < 0) {
      PushStack(NIL_PTR);
      rest++;
    }
    CurrentStackPTR -= (rest << 1);
  } /* if end */

  /* Set up BF */
  CurrentStackPTR += 2;
  GETWORD(CurrentStackPTR) = BF_MARK;
  GETWORD(CurrentStackPTR + 1) = CURRENTFX->nextblock;
  CurrentStackPTR += 2;

  /* Set up FX */
  GETWORD(CurrentStackPTR) = FX_MARK;

  /* Now SET new FX */
  /* Make it SLOWP */
  ((FX *)CurrentStackPTR)->alink = StackOffsetFromNative(PVar) + 1;
  ((FX *)CurrentStackPTR)->blink = StackOffsetFromNative(DUMMYBF(CurrentStackPTR));
  ((FX *)CurrentStackPTR)->clink = StackOffsetFromNative(PVar);
  PVar = (DLword *)CurrentStackPTR + FRAMESIZE;
#ifdef BIGVM
  ((FX *)CurrentStackPTR)->fnheader = (defcell68k->defpointer);
#else
  ((FX *)CurrentStackPTR)->lofnheader = (defcell68k->defpointer) & 0x0ffff;
  ((FX *)CurrentStackPTR)->hi2fnheader = ((defcell68k->defpointer) & SEGMASK) >> 16;
#endif /* BIGVM */

  CurrentStackPTR = PVar;

  /* Set up PVar area */
  pv_num = FuncObj->pv + 1;
  while (pv_num > 0) {
    *((LispPTR *)CurrentStackPTR) = 0x0ffffffff;
    CurrentStackPTR += DLWORDSPER_CELL;
    *((LispPTR *)CurrentStackPTR) = 0x0ffffffff;
    CurrentStackPTR += DLWORDSPER_CELL;
    pv_num--;
  }

  /* Set PC points New Function's first OPCODE */
  PC = (ByteCode *)FuncObj + FuncObj->startpc;
  CURRENTFX->nextblock = StackOffsetFromNative(CurrentStackPTR);
  MAKEFREEBLOCK(CurrentStackPTR, ((UNSIGNED)EndSTKP - (UNSIGNED)CurrentStackPTR) >> 1);
}